

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

void __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
::BPlusTree(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
            *this,bool dupes_allowed)

{
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  **ppBVar1;
  
  this->data_size = 0;
  this->subset_size = 0;
  b_array::
  Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  ::Array(&this->data,3);
  (this->subset).data =
       (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
        **)0x0;
  (this->subset).capacity = 4;
  ppBVar1 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
             **)operator_new__(0x20);
  ppBVar1[2] = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *)0x0;
  ppBVar1[3] = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *)0x0;
  *ppBVar1 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
              *)0x0;
  ppBVar1[1] = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *)0x0;
  (this->subset).data = ppBVar1;
  this->duplicates_allowed = dupes_allowed;
  this->next = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
                *)0x0;
  return;
}

Assistant:

BPlusTree<T>::BPlusTree(bool dupes_allowed) : duplicates_allowed(dupes_allowed) {}